

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

shared_ptr<Scope> __thiscall linb::any_cast<std::shared_ptr<Scope>>(linb *this,any *operand)

{
  type_info *ptVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Scope> sVar3;
  
  if (operand->vtable != (vtable_type *)0x0) {
    ptVar1 = (*operand->vtable->type)();
    if (ptVar1 == (type_info *)&std::shared_ptr<Scope>::typeinfo) {
      std::__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2> *)operand);
      sVar3.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar3.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (shared_ptr<Scope>)sVar3.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_00242e20;
  __cxa_throw(puVar2,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

bool empty() const noexcept
    {
        return this->vtable == nullptr;
    }